

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkTestTimCollectCone(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj_1;
  Vec_Ptr_t *vCone;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtk_local;
  
  vNodes = Vec_PtrAlloc(1000);
  if (pObj == (Abc_Obj_t *)0x0) {
    for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_2c);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      Abc_NtkTestTimCollectCone_rec(pAVar2,vNodes);
    }
  }
  else {
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                    ,0xd4,"Vec_Ptr_t *Abc_NtkTestTimCollectCone(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    iVar1 = Abc_NodeIsTravIdCurrent(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Abc_NodeIsTravIdCurrent( pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                    ,0xd5,"Vec_Ptr_t *Abc_NtkTestTimCollectCone(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    Abc_NtkTestTimCollectCone_rec(pObj,vNodes);
    Vec_PtrPop(vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkTestTimCollectCone( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    Vec_Ptr_t * vCone = Vec_PtrAlloc( 1000 );
    if ( pObj != NULL )
    {
        // collect for one node
        assert( Abc_ObjIsNode(pObj) );
        assert( !Abc_NodeIsTravIdCurrent( pObj ) );
        Abc_NtkTestTimCollectCone_rec( pObj, vCone );
        // remove the node because it is a white box
        Vec_PtrPop( vCone );
    }
    else
    {
        // collect for all COs
        Abc_Obj_t * pObj;
        int i;
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_NtkTestTimCollectCone_rec( Abc_ObjFanin0(pObj), vCone );
    }
    return vCone;

}